

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O0

void Lpk_NodeCutsOne(Lpk_Man_t *p,Lpk_Cut_t *pCut,int Node)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar2;
  Lpk_Cut_t *pCut_00;
  uint uVar3;
  int local_48;
  uint local_44;
  int nLeavesNew;
  int j;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Lpk_Cut_t *pCutNew;
  int Node_local;
  Lpk_Cut_t *pCut_local;
  Lpk_Man_t *p_local;
  
  if ((*(uint *)pCut >> 6 & 0x3f) != 0x18) {
    pObj_00 = Abc_NtkObj(p->pNtk,Node);
    iVar1 = Abc_ObjIsCi(pObj_00);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsNode(pObj_00);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                      ,0x1ef,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
      }
      iVar1 = Abc_NodeIsTravIdCurrent(pObj_00);
      if (iVar1 == 0) {
        if ((*(uint *)pCut >> 0xc & 0x3f) == p->pPars->nLutsOver) {
          return;
        }
        if (p->pPars->nLutsOver <= (int)(*(uint *)pCut >> 0xc & 0x3f)) {
          __assert_fail("(int)pCut->nNodesDup < p->pPars->nLutsOver",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                        ,0x1f7,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
        }
      }
      local_48 = (*(uint *)pCut & 0x3f) - 1;
      for (j = 0; iVar1 = Abc_ObjFaninNum(pObj_00), j < iVar1; j = j + 1) {
        pAVar2 = Abc_ObjFanin(pObj_00,j);
        if (((pCut->uSign[(int)(uint)((pAVar2->Id & 0x20U) != 0)] & 1 << ((byte)pAVar2->Id & 0x1f))
             == 0) && (local_48 = local_48 + 1, p->pPars->nVarsMax < local_48)) {
          return;
        }
      }
      if (0x1ff < p->nCuts) {
        __assert_fail("p->nCuts < LPK_CUTS_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                      ,0x205,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
      }
      pCut_00 = p->pCuts + p->nCuts;
      *(uint *)pCut_00 = *(uint *)pCut_00 & 0xffffffc0;
      for (j = 0; j < (int)(*(uint *)pCut & 0x3f); j = j + 1) {
        if (pCut->pLeaves[j] != Node) {
          iVar1 = pCut->pLeaves[j];
          uVar3 = *(uint *)pCut_00;
          *(uint *)pCut_00 = *(uint *)pCut_00 & 0xffffffc0 | (uVar3 & 0x3f) + 1 & 0x3f;
          pCut_00->pLeaves[uVar3 & 0x3f] = iVar1;
        }
      }
      for (j = 0; iVar1 = Abc_ObjFaninNum(pObj_00), j < iVar1; j = j + 1) {
        pAVar2 = Abc_ObjFanin(pObj_00,j);
        for (nLeavesNew = 0;
            (nLeavesNew < (int)(*(uint *)pCut_00 & 0x3f) &&
            (pCut_00->pLeaves[nLeavesNew] < pAVar2->Id)); nLeavesNew = nLeavesNew + 1) {
        }
        if (((int)(*(uint *)pCut_00 & 0x3f) <= nLeavesNew) ||
           (pCut_00->pLeaves[nLeavesNew] != pAVar2->Id)) {
          if ((*(uint *)pCut_00 & 0x3f) == p->pPars->nVarsMax) {
            return;
          }
          for (local_44 = *(uint *)pCut_00 & 0x3f; nLeavesNew < (int)local_44;
              local_44 = local_44 - 1) {
            pCut_00->pLeaves[(int)local_44] = pCut_00->pLeaves[(int)(local_44 - 1)];
          }
          pCut_00->pLeaves[nLeavesNew] = pAVar2->Id;
          *(uint *)pCut_00 = *(uint *)pCut_00 & 0xffffffc0 | (*(uint *)pCut_00 & 0x3f) + 1 & 0x3f;
          if (0x18 < (*(uint *)pCut_00 & 0x3f)) {
            __assert_fail("pCutNew->nLeaves <= LPK_SIZE_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                          ,0x21d,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
          }
        }
      }
      Lpk_NodeCutSignature(pCut_00);
      iVar1 = Lpk_NodeCutsOneFilter(p->pCuts,p->nCuts,pCut_00);
      if (iVar1 == 0) {
        if (0x17 < (*(uint *)pCut >> 6 & 0x3f)) {
          __assert_fail("pCut->nNodes < LPK_SIZE_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                        ,0x226,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
        }
        memcpy(pCut_00->pNodes,pCut->pNodes,(ulong)(*(uint *)pCut >> 6 & 0x3f) << 2);
        *(uint *)pCut_00 = *(uint *)pCut_00 & 0xfffff03f | (*(uint *)pCut >> 6 & 0x3f) << 6;
        *(uint *)pCut_00 = *(uint *)pCut_00 & 0xfffc0fff | (*(uint *)pCut >> 0xc & 0x3f) << 0xc;
        j = 0;
        while( true ) {
          if ((int)(*(uint *)pCut_00 >> 6 & 0x3f) <= j) goto LAB_005a3554;
          if (pCut_00->pNodes[j] == Node) break;
          j = j + 1;
        }
        for (nLeavesNew = j; nLeavesNew < (int)((*(uint *)pCut_00 >> 6 & 0x3f) - 1);
            nLeavesNew = nLeavesNew + 1) {
          pCut_00->pNodes[nLeavesNew] = pCut_00->pNodes[nLeavesNew + 1];
        }
        pCut_00->pNodes[nLeavesNew] = Node;
LAB_005a3554:
        if (j == (*(uint *)pCut_00 >> 6 & 0x3f)) {
          uVar3 = *(uint *)pCut_00 >> 6 & 0x3f;
          *(uint *)pCut_00 = *(uint *)pCut_00 & 0xfffff03f | (uVar3 + 1 & 0x3f) << 6;
          pCut_00->pNodes[uVar3] = Node;
          iVar1 = Abc_NodeIsTravIdCurrent(pObj_00);
          *(uint *)pCut_00 =
               *(uint *)pCut_00 & 0xfffc0fff |
               ((*(uint *)pCut_00 >> 0xc & 0x3f) + (uint)((iVar1 != 0 ^ 0xffU) & 1) & 0x3f) << 0xc;
        }
        if ((int)(p->nMffc + (*(uint *)pCut_00 >> 0xc & 0x3f)) < (int)(*(uint *)pCut_00 >> 6 & 0x3f)
           ) {
          __assert_fail("pCutNew->nNodes <= p->nMffc + pCutNew->nNodesDup",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                        ,0x23b,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
        }
        if (0x1ff < p->nCuts) {
          __assert_fail("p->nCuts < LPK_CUTS_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                        ,0x23d,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
        }
        p->nCuts = p->nCuts + 1;
      }
    }
  }
  return;
}

Assistant:

void Lpk_NodeCutsOne( Lpk_Man_t * p, Lpk_Cut_t * pCut, int Node )
{
    Lpk_Cut_t * pCutNew;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, j, nLeavesNew;
/*
    printf( "Exploring cut " );
    Lpk_NodePrintCut( p, pCut, 1 );
    printf( "with node %d\n", Node );
*/
    // check if the cut can stand adding one more internal node
    if ( pCut->nNodes == LPK_SIZE_MAX )
        return;

    // if the node is a PI, quit
    pObj = Abc_NtkObj( p->pNtk, Node );
    if ( Abc_ObjIsCi(pObj) )
        return;
    assert( Abc_ObjIsNode(pObj) );
//    assert( Abc_ObjFaninNum(pObj) <= p->pPars->nLutSize );

    // if the node is not in the MFFC, check the limit
    if ( !Abc_NodeIsTravIdCurrent(pObj) )
    {
        if ( (int)pCut->nNodesDup == p->pPars->nLutsOver )
            return;
        assert( (int)pCut->nNodesDup < p->pPars->nLutsOver );
    }

    // check the possibility of adding this node using the signature
    nLeavesNew = pCut->nLeaves - 1;
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        if ( (pCut->uSign[(pFanin->Id & 32) > 0] & (1 << (pFanin->Id & 31))) )
            continue;
        if ( ++nLeavesNew > p->pPars->nVarsMax )
            return;
    }

    // initialize the set of leaves to the nodes in the cut
    assert( p->nCuts < LPK_CUTS_MAX );
    pCutNew = p->pCuts + p->nCuts;
    pCutNew->nLeaves = 0;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        if ( pCut->pLeaves[i] != Node )
            pCutNew->pLeaves[pCutNew->nLeaves++] = pCut->pLeaves[i];

    // add new nodes
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        // find the place where this node belongs
        for ( k = 0; k < (int)pCutNew->nLeaves; k++ )
            if ( pCutNew->pLeaves[k] >= pFanin->Id )
                break;
        if ( k < (int)pCutNew->nLeaves && pCutNew->pLeaves[k] == pFanin->Id )
            continue;
        // check if there is room
        if ( (int)pCutNew->nLeaves == p->pPars->nVarsMax )
            return;
        // move all the nodes
        for ( j = pCutNew->nLeaves; j > k; j-- )
            pCutNew->pLeaves[j] = pCutNew->pLeaves[j-1];
        pCutNew->pLeaves[k] = pFanin->Id;
        pCutNew->nLeaves++;
        assert( pCutNew->nLeaves <= LPK_SIZE_MAX );

    }
    // skip the contained cuts
    Lpk_NodeCutSignature( pCutNew );
    if ( Lpk_NodeCutsOneFilter( p->pCuts, p->nCuts, pCutNew ) )
        return;

    // update the set of internal nodes
    assert( pCut->nNodes < LPK_SIZE_MAX );
    memcpy( pCutNew->pNodes, pCut->pNodes, pCut->nNodes * sizeof(int) );
    pCutNew->nNodes = pCut->nNodes;
    pCutNew->nNodesDup = pCut->nNodesDup;

    // check if the node is already there
    // if so, move the node to be the last
    for ( i = 0; i < (int)pCutNew->nNodes; i++ )
        if ( pCutNew->pNodes[i] == Node )
        {
            for ( k = i; k < (int)pCutNew->nNodes - 1; k++ )
                pCutNew->pNodes[k] = pCutNew->pNodes[k+1];
            pCutNew->pNodes[k] = Node;
            break;
        }
    if ( i == (int)pCutNew->nNodes ) // new node
    {
        pCutNew->pNodes[ pCutNew->nNodes++ ] = Node;
        pCutNew->nNodesDup += !Abc_NodeIsTravIdCurrent(pObj);
    }
    // the number of nodes does not exceed MFFC plus duplications
    assert( pCutNew->nNodes <= p->nMffc + pCutNew->nNodesDup );
    // add the cut to storage
    assert( p->nCuts < LPK_CUTS_MAX );
    p->nCuts++;
}